

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaConfig.cpp
# Opt level: O2

void __thiscall NaConfigFile::~NaConfigFile(NaConfigFile *this)

{
  (this->super_NaDataStream)._vptr_NaDataStream = (_func_int **)&PTR__NaConfigFile_00173ec0;
  if (this->szMagicString != (char *)0x0) {
    operator_delete__(this->szMagicString);
  }
  if (this->szFileExtString != (char *)0x0) {
    operator_delete__(this->szFileExtString);
  }
  if (this->szMarksBuf != (char *)0x0) {
    operator_delete__(this->szMarksBuf);
  }
  NaDynAr<NaCPRegItem>::~NaDynAr(&this->arReg);
  NaDataStream::~NaDataStream(&this->super_NaDataStream);
  return;
}

Assistant:

NaConfigFile::~NaConfigFile ()
{
    delete[] szMagicString;
    delete[] szFileExtString;
    delete[] szMarksBuf;
}